

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

int __thiscall
f8n::prefs::Preferences::GetString
          (Preferences *this,char *key,char *dst,size_t size,char *defaultValue)

{
  undefined8 __s;
  int iVar1;
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  str local_50 [8];
  string value;
  char *defaultValue_local;
  size_t size_local;
  char *dst_local;
  char *key_local;
  Preferences *this_local;
  
  value.field_2._8_8_ = defaultValue;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,key,&local_71);
  __s = value.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,(char *)__s,&local_a9);
  (*(this->super_IPreferences)._vptr_IPreferences[0xd])(local_50,this,local_70,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  iVar1 = f8n::str::copy(local_50,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)size);
  std::__cxx11::string::~string((string *)local_50);
  return iVar1;
}

Assistant:

int Preferences::GetString(const char* key, char* dst, size_t size, const char* defaultValue) {
    std::string value = this->GetString(std::string(key), defaultValue);
    return str::copy(value, dst, size);
}